

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O0

void Io_ReadPlaMarkContained(word **pCs,int nCubes,int nWords,Vec_Bit_t *vMarks)

{
  int iVar1;
  int local_28;
  int local_24;
  int c2;
  int c1;
  Vec_Bit_t *vMarks_local;
  int nWords_local;
  int nCubes_local;
  word **pCs_local;
  
  Vec_BitFill(vMarks,nCubes,0);
  local_24 = 0;
  do {
    if (nCubes <= local_24) {
      return;
    }
    iVar1 = Vec_BitEntry(vMarks,local_24);
    local_28 = local_24;
    if (iVar1 == 0) {
      do {
        while( true ) {
          do {
            local_28 = local_28 + 1;
            if (nCubes <= local_28) goto LAB_0035242a;
            iVar1 = Vec_BitEntry(vMarks,local_28);
          } while (iVar1 != 0);
          iVar1 = Abc_TtImply(pCs[local_24],pCs[local_28],nWords);
          if (iVar1 == 0) break;
          Vec_BitWriteEntry(vMarks,local_28,1);
        }
        iVar1 = Abc_TtImply(pCs[local_28],pCs[local_24],nWords);
      } while (iVar1 == 0);
      Vec_BitWriteEntry(vMarks,local_24,1);
    }
LAB_0035242a:
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void Io_ReadPlaMarkContained( word ** pCs, int nCubes, int nWords, Vec_Bit_t * vMarks )
{
    int c1, c2;
    Vec_BitFill( vMarks, nCubes, 0 );
    for ( c1 = 0; c1 < nCubes; c1++ )
        if ( !Vec_BitEntry(vMarks, c1) )
            for ( c2 = c1 + 1; c2 < nCubes; c2++ )
                if ( !Vec_BitEntry(vMarks, c2) )
                {
                    if ( Abc_TtImply(pCs[c1], pCs[c2], nWords) )
                        Vec_BitWriteEntry( vMarks, c2, 1 );
                    else if ( Abc_TtImply(pCs[c2], pCs[c1], nWords) )
                    {
                        Vec_BitWriteEntry( vMarks, c1, 1 );
                        break;
                    }
                }
}